

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineBspline.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChLineBspline::Evaluate(ChLineBspline *this,ChVector<double> *pos,double parU)

{
  double *pdVar1;
  pointer pCVar2;
  int i;
  int iVar3;
  Scalar *pSVar4;
  long lVar5;
  long index;
  double u;
  ChVectorDynamic<> N;
  ChVector<double> v;
  Matrix<double,__1,_1,_0,__1,_1> local_58;
  ChVector<double> local_48;
  
  if (this->closed == true) {
    parU = fmod(parU,1.0);
  }
  u = ComputeKnotUfromU(this,parU);
  i = ChBasisToolsBspline::FindSpan(this->p,u,&this->knots);
  local_48.m_data[0] = (double)CONCAT44(local_48.m_data[0]._4_4_,this->p + 1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_58,(int *)&local_48);
  ChBasisToolsBspline::BasisEvaluate(this->p,i,u,&this->knots,&local_58);
  if (pos != (ChVector<double> *)&VNULL) {
    pos->m_data[0] = VNULL;
    pos->m_data[1] = DAT_011dd3e0;
    pos->m_data[2] = DAT_011dd3e8;
  }
  iVar3 = this->p;
  lVar5 = (long)(i - iVar3) * 0x18 + 0x10;
  for (index = 0; index <= iVar3; index = index + 1) {
    pCVar2 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,
                        index);
    local_48.m_data[2] = *pSVar4;
    pdVar1 = (double *)((long)pCVar2->m_data + lVar5 + -0x10);
    local_48.m_data[0] = local_48.m_data[2] * *pdVar1;
    local_48.m_data[1] = local_48.m_data[2] * pdVar1[1];
    local_48.m_data[2] = local_48.m_data[2] * *(double *)((long)pCVar2->m_data + lVar5);
    ChVector<double>::operator+=(pos,&local_48);
    iVar3 = this->p;
    lVar5 = lVar5 + 0x18;
  }
  Eigen::internal::handmade_aligned_free
            (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChLineBspline::Evaluate(ChVector<>& pos, const double parU) const {
	double mU;
	if (this->closed)
		mU = fmod(parU, 1.0);
	else
		mU = parU;

    double u = ComputeKnotUfromU(mU);

    int spanU = ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    ChVectorDynamic<> N(this->p + 1);
    ChBasisToolsBspline::BasisEvaluate(this->p, spanU, u, this->knots, N);

    pos = VNULL;
    int uind = spanU - p;
    for (int i = 0; i <= this->p; i++) {
        pos += points[uind + i] * N(i);
    }
}